

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

void __thiscall re2c::path_t::append(path_t *this,path_t *p)

{
  bool bVar1;
  size_type sVar2;
  const_iterator __first;
  const_iterator __last;
  __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_**,_std::vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  local_28;
  const_iterator local_20;
  path_t *local_18;
  path_t *p_local;
  path_t *this_local;
  
  local_18 = p;
  p_local = this;
  bVar1 = rule_rank_t::is_none(&(p->rule).rank);
  if (!bVar1) {
    (this->rule).rank.value = (local_18->rule).rank.value;
    (this->rule).restorectx = (local_18->rule).restorectx;
    sVar2 = std::
            vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ::size(&this->arcs);
    this->rule_pos = sVar2 + local_18->rule_pos;
  }
  if ((local_18->ctx & 1U) != 0) {
    this->ctx = true;
    sVar2 = std::
            vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ::size(&this->arcs);
    this->ctx_pos = sVar2 + local_18->ctx_pos;
  }
  local_28._M_current =
       (vector<unsigned_int,_std::allocator<unsigned_int>_> **)
       std::
       vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
       ::end(&this->arcs);
  __gnu_cxx::
  __normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>
  ::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const**>
            ((__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>
              *)&local_20,&local_28);
  __first = std::
            vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ::begin(&local_18->arcs);
  __last = std::
           vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
           ::end(&local_18->arcs);
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*const*,std::vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>>,void>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>const*,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>const*>>
              *)this,local_20,
             (__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*const_*,_std::vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              )__first._M_current,
             (__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*const_*,_std::vector<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
              )__last._M_current);
  return;
}

Assistant:

void append (const path_t * p)
	{
		if (!p->rule.rank.is_none ())
		{
			rule = p->rule;
			rule_pos = arcs.size () + p->rule_pos;
		}
		if (p->ctx)
		{
			ctx = true;
			ctx_pos = arcs.size () + p->ctx_pos;
		}
		arcs.insert (arcs.end (), p->arcs.begin (), p->arcs.end ());
	}